

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_SHA2.cc
# Opt level: O0

void __thiscall Pl_SHA2::Pl_SHA2(Pl_SHA2 *this,int bits,Pipeline *next)

{
  Pipeline *next_local;
  int bits_local;
  Pl_SHA2 *this_local;
  
  Pipeline::Pipeline(&this->super_Pipeline,"sha2",next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_SHA2_0058b5e8;
  this->in_progress = false;
  std::shared_ptr<QPDFCryptoImpl>::shared_ptr(&this->crypto);
  if (bits != 0) {
    resetBits(this,bits);
  }
  return;
}

Assistant:

Pl_SHA2::Pl_SHA2(int bits, Pipeline* next) :
    Pipeline("sha2", next),
    in_progress(false)
{
    if (bits) {
        resetBits(bits);
    }
}